

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode parse_proxy(Curl_easy *data,connectdata *conn,char *proxy,curl_proxytype proxytype)

{
  int iVar1;
  long lVar2;
  size_t sVar3;
  CURLU *local_90;
  bool local_81;
  size_t len;
  char *scheme;
  CURLU *pCStack_68;
  CURLcode result;
  CURLU *uhp;
  proxy_info *proxyinfo;
  CURLUcode uc;
  _Bool sockstype;
  char *host;
  char *proxypasswd;
  char *proxyuser;
  char *pcStack_30;
  int port;
  char *portptr;
  char *pcStack_20;
  curl_proxytype proxytype_local;
  char *proxy_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  pcStack_30 = (char *)0x0;
  proxyuser._4_4_ = -1;
  proxypasswd = (char *)0x0;
  host = (char *)0x0;
  portptr._4_4_ = proxytype;
  pcStack_20 = proxy;
  proxy_local = (char *)conn;
  conn_local = (connectdata *)data;
  pCStack_68 = curl_url();
  scheme._4_4_ = CURLE_OK;
  len = 0;
  proxyinfo._0_4_ = curl_url_set(pCStack_68,CURLUPART_URL,pcStack_20,0x208);
  if ((CURLUcode)proxyinfo == CURLUE_OK) {
    proxyinfo._0_4_ = curl_url_get(pCStack_68,CURLUPART_SCHEME,(char **)&len,0);
    if ((CURLUcode)proxyinfo == CURLUE_OK) {
      iVar1 = Curl_strcasecompare("https",(char *)len);
      if (iVar1 == 0) {
        iVar1 = Curl_strcasecompare("socks5h",(char *)len);
        if (iVar1 == 0) {
          iVar1 = Curl_strcasecompare("socks5",(char *)len);
          if (iVar1 == 0) {
            iVar1 = Curl_strcasecompare("socks4a",(char *)len);
            if (iVar1 == 0) {
              iVar1 = Curl_strcasecompare("socks4",(char *)len);
              if ((iVar1 == 0) && (iVar1 = Curl_strcasecompare("socks",(char *)len), iVar1 == 0)) {
                iVar1 = Curl_strcasecompare("http",(char *)len);
                if (iVar1 == 0) {
                  Curl_failf((Curl_easy *)conn_local,"Unsupported proxy scheme for \'%s\'",
                             pcStack_20);
                  scheme._4_4_ = CURLE_COULDNT_CONNECT;
                  goto LAB_0017ccc1;
                }
              }
              else {
                portptr._4_4_ = CURLPROXY_SOCKS4;
              }
            }
            else {
              portptr._4_4_ = CURLPROXY_SOCKS4A;
            }
          }
          else {
            portptr._4_4_ = CURLPROXY_SOCKS5;
          }
        }
        else {
          portptr._4_4_ = CURLPROXY_SOCKS5_HOSTNAME;
        }
      }
      else {
        portptr._4_4_ = CURLPROXY_HTTPS;
      }
      if (((Curl_ssl->supports & 0x10) == 0) && (portptr._4_4_ == CURLPROXY_HTTPS)) {
        Curl_failf((Curl_easy *)conn_local,
                   "Unsupported proxy \'%s\', libcurl is built without the HTTPS-proxy support.",
                   pcStack_20);
        scheme._4_4_ = CURLE_NOT_BUILT_IN;
      }
      else {
        local_81 = true;
        if (((portptr._4_4_ != CURLPROXY_SOCKS5_HOSTNAME) &&
            (local_81 = true, portptr._4_4_ != CURLPROXY_SOCKS5)) &&
           (local_81 = true, portptr._4_4_ != CURLPROXY_SOCKS4A)) {
          local_81 = portptr._4_4_ == CURLPROXY_SOCKS4;
        }
        proxyinfo._7_1_ = local_81;
        if (local_81 == false) {
          local_90 = (CURLU *)(proxy_local + 0x120);
        }
        else {
          local_90 = (CURLU *)(proxy_local + 0xe0);
        }
        uhp = local_90;
        *(curl_proxytype *)&local_90->zoneid = portptr._4_4_;
        proxyinfo._0_4_ = curl_url_get(pCStack_68,CURLUPART_USER,&proxypasswd,0x40);
        if ((((CURLUcode)proxyinfo == CURLUE_OK) || ((CURLUcode)proxyinfo == CURLUE_NO_USER)) &&
           ((proxyinfo._0_4_ = curl_url_get(pCStack_68,CURLUPART_PASSWORD,&host,0x40),
            (CURLUcode)proxyinfo == CURLUE_OK || ((CURLUcode)proxyinfo == CURLUE_NO_PASSWORD)))) {
          if ((proxypasswd != (char *)0x0) || (host != (char *)0x0)) {
            (*Curl_cfree)(uhp->port);
            uhp->port = (char *)0x0;
            uhp->port = proxypasswd;
            scheme._4_4_ = Curl_setstropt(&conn_local[3].ssl_config.egdsocket,proxypasswd);
            proxypasswd = (char *)0x0;
            if (scheme._4_4_ != CURLE_OK) goto LAB_0017ccc1;
            (*Curl_cfree)(uhp->path);
            uhp->path = (char *)0x0;
            if ((host == (char *)0x0) && (host = (*Curl_cstrdup)(""), host == (char *)0x0)) {
              scheme._4_4_ = CURLE_OUT_OF_MEMORY;
              host = (char *)0x0;
              goto LAB_0017ccc1;
            }
            uhp->path = host;
            scheme._4_4_ = Curl_setstropt(&conn_local[3].ssl_config.cipher_list,host);
            host = (char *)0x0;
            if (scheme._4_4_ != CURLE_OK) goto LAB_0017ccc1;
            *(ulong *)(proxy_local + 0x37c) =
                 *(ulong *)(proxy_local + 0x37c) & 0xfffffffffffffffb | 4;
          }
          curl_url_get(pCStack_68,CURLUPART_PORT,&stack0xffffffffffffffd0,0);
          if (pcStack_30 == (char *)0x0) {
            if ((conn_local->now).tv_sec == 0) {
              if (portptr._4_4_ == CURLPROXY_HTTPS) {
                proxyuser._4_4_ = 0x1bb;
              }
              else {
                proxyuser._4_4_ = 0x438;
              }
            }
            else {
              proxyuser._4_4_ = (int)(conn_local->now).tv_sec;
            }
          }
          else {
            lVar2 = strtol(pcStack_30,(char **)0x0,10);
            proxyuser._4_4_ = (int)lVar2;
            (*Curl_cfree)(pcStack_30);
          }
          if ((-1 < proxyuser._4_4_) &&
             (((uhp->host = (char *)(long)proxyuser._4_4_, *(int *)(proxy_local + 0x160) < 0 ||
               ((proxyinfo._7_1_ & 1) != 0)) || (*(long *)(proxy_local + 0xe0) == 0)))) {
            *(int *)(proxy_local + 0x160) = proxyuser._4_4_;
          }
          proxyinfo._0_4_ = curl_url_get(pCStack_68,CURLUPART_HOST,(char **)&uc,0x40);
          if ((CURLUcode)proxyinfo == CURLUE_OK) {
            (*Curl_cfree)(uhp->scheme);
            uhp->scheme = (char *)0x0;
            uhp->scheme = _uc;
            if (*_uc == '[') {
              sVar3 = strlen(_uc);
              _uc[sVar3 - 1] = '\0';
              _uc = _uc + 1;
              zonefrom_url(pCStack_68,(Curl_easy *)conn_local,(connectdata *)proxy_local);
            }
            uhp->password = _uc;
          }
          else {
            scheme._4_4_ = CURLE_OUT_OF_MEMORY;
          }
        }
      }
    }
    else {
      scheme._4_4_ = CURLE_OUT_OF_MEMORY;
    }
  }
  else {
    Curl_failf((Curl_easy *)conn_local,"Unsupported proxy syntax in \'%s\'",pcStack_20);
    scheme._4_4_ = CURLE_COULDNT_RESOLVE_PROXY;
  }
LAB_0017ccc1:
  (*Curl_cfree)(proxypasswd);
  (*Curl_cfree)(host);
  (*Curl_cfree)((void *)len);
  curl_url_cleanup(pCStack_68);
  return scheme._4_4_;
}

Assistant:

static CURLcode parse_proxy(struct Curl_easy *data,
                            struct connectdata *conn, char *proxy,
                            curl_proxytype proxytype)
{
  char *portptr = NULL;
  int port = -1;
  char *proxyuser = NULL;
  char *proxypasswd = NULL;
  char *host;
  bool sockstype;
  CURLUcode uc;
  struct proxy_info *proxyinfo;
  CURLU *uhp = curl_url();
  CURLcode result = CURLE_OK;
  char *scheme = NULL;

  /* When parsing the proxy, allowing non-supported schemes since we have
     these made up ones for proxies. Guess scheme for URLs without it. */
  uc = curl_url_set(uhp, CURLUPART_URL, proxy,
                    CURLU_NON_SUPPORT_SCHEME|CURLU_GUESS_SCHEME);
  if(!uc) {
    /* parsed okay as a URL */
    uc = curl_url_get(uhp, CURLUPART_SCHEME, &scheme, 0);
    if(uc) {
      result = CURLE_OUT_OF_MEMORY;
      goto error;
    }

    if(strcasecompare("https", scheme))
      proxytype = CURLPROXY_HTTPS;
    else if(strcasecompare("socks5h", scheme))
      proxytype = CURLPROXY_SOCKS5_HOSTNAME;
    else if(strcasecompare("socks5", scheme))
      proxytype = CURLPROXY_SOCKS5;
    else if(strcasecompare("socks4a", scheme))
      proxytype = CURLPROXY_SOCKS4A;
    else if(strcasecompare("socks4", scheme) ||
            strcasecompare("socks", scheme))
      proxytype = CURLPROXY_SOCKS4;
    else if(strcasecompare("http", scheme))
      ; /* leave it as HTTP or HTTP/1.0 */
    else {
      /* Any other xxx:// reject! */
      failf(data, "Unsupported proxy scheme for \'%s\'", proxy);
      result = CURLE_COULDNT_CONNECT;
      goto error;
    }
  }
  else {
    failf(data, "Unsupported proxy syntax in \'%s\'", proxy);
    result = CURLE_COULDNT_RESOLVE_PROXY;
    goto error;
  }

#ifdef USE_SSL
  if(!(Curl_ssl->supports & SSLSUPP_HTTPS_PROXY))
#endif
    if(proxytype == CURLPROXY_HTTPS) {
      failf(data, "Unsupported proxy \'%s\', libcurl is built without the "
                  "HTTPS-proxy support.", proxy);
      result = CURLE_NOT_BUILT_IN;
      goto error;
    }

  sockstype =
    proxytype == CURLPROXY_SOCKS5_HOSTNAME ||
    proxytype == CURLPROXY_SOCKS5 ||
    proxytype == CURLPROXY_SOCKS4A ||
    proxytype == CURLPROXY_SOCKS4;

  proxyinfo = sockstype ? &conn->socks_proxy : &conn->http_proxy;
  proxyinfo->proxytype = proxytype;

  /* Is there a username and password given in this proxy url? */
  uc = curl_url_get(uhp, CURLUPART_USER, &proxyuser, CURLU_URLDECODE);
  if(uc && (uc != CURLUE_NO_USER))
    goto error;
  uc = curl_url_get(uhp, CURLUPART_PASSWORD, &proxypasswd, CURLU_URLDECODE);
  if(uc && (uc != CURLUE_NO_PASSWORD))
    goto error;

  if(proxyuser || proxypasswd) {
    Curl_safefree(proxyinfo->user);
    proxyinfo->user = proxyuser;
    result = Curl_setstropt(&data->state.aptr.proxyuser, proxyuser);
    proxyuser = NULL;
    if(result)
      goto error;
    Curl_safefree(proxyinfo->passwd);
    if(!proxypasswd) {
      proxypasswd = strdup("");
      if(!proxypasswd) {
        result = CURLE_OUT_OF_MEMORY;
        goto error;
      }
    }
    proxyinfo->passwd = proxypasswd;
    result = Curl_setstropt(&data->state.aptr.proxypasswd, proxypasswd);
    proxypasswd = NULL;
    if(result)
      goto error;
    conn->bits.proxy_user_passwd = TRUE; /* enable it */
  }

  (void)curl_url_get(uhp, CURLUPART_PORT, &portptr, 0);

  if(portptr) {
    port = (int)strtol(portptr, NULL, 10);
    free(portptr);
  }
  else {
    if(data->set.proxyport)
      /* None given in the proxy string, then get the default one if it is
         given */
      port = (int)data->set.proxyport;
    else {
      if(proxytype == CURLPROXY_HTTPS)
        port = CURL_DEFAULT_HTTPS_PROXY_PORT;
      else
        port = CURL_DEFAULT_PROXY_PORT;
    }
  }
  if(port >= 0) {
    proxyinfo->port = port;
    if(conn->port < 0 || sockstype || !conn->socks_proxy.host.rawalloc)
      conn->port = port;
  }

  /* now, clone the proxy host name */
  uc = curl_url_get(uhp, CURLUPART_HOST, &host, CURLU_URLDECODE);
  if(uc) {
    result = CURLE_OUT_OF_MEMORY;
    goto error;
  }
  Curl_safefree(proxyinfo->host.rawalloc);
  proxyinfo->host.rawalloc = host;
  if(host[0] == '[') {
    /* this is a numerical IPv6, strip off the brackets */
    size_t len = strlen(host);
    host[len-1] = 0; /* clear the trailing bracket */
    host++;
    zonefrom_url(uhp, data, conn);
  }
  proxyinfo->host.name = host;

  error:
  free(proxyuser);
  free(proxypasswd);
  free(scheme);
  curl_url_cleanup(uhp);
  return result;
}